

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

void Cmd::ltrim(string *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  undefined8 local_18;
  string *local_10;
  string *s_local;
  
  local_10 = s;
  local_20._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_18,&local_20);
  uVar1 = std::__cxx11::string::begin();
  uVar2 = std::__cxx11::string::end();
  local_30 = std::
             find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,Cmd::ltrim(std::__cxx11::string&)::_lambda(unsigned_char)_1_>
                       (uVar1,uVar2);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
  std::__cxx11::string::erase(s,local_18,local_28);
  return;
}

Assistant:

static void ltrim(std::string &s) {
		s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](unsigned char ch) { return !std::isspace(ch); }));
	}